

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_MovePlayer(player_t *player)

{
  double dVar1;
  APlayerPawn *pAVar2;
  msecnode_t *pmVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  undefined8 in_R9;
  msecnode_t **ppmVar7;
  double dVar8;
  double dVar9;
  undefined8 extraout_XMM0_Qb;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  double friction;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  double local_40;
  double local_38;
  
  pAVar2 = player->mo;
  if (player->turnticks == '\0') {
    dVar8 = (double)(int)(player->cmd).ucmd.yaw * 0.0054931640625;
  }
  else {
    player->turnticks = player->turnticks + 0xff;
    dVar8 = 20.0;
  }
  (pAVar2->super_AActor).Angles.Yaw.Degrees = dVar8 + (pAVar2->super_AActor).Angles.Yaw.Degrees;
  bVar5 = true;
  if ((((pAVar2->super_AActor).floorz < (pAVar2->super_AActor).__Pos.Z) &&
      (((pAVar2->super_AActor).flags2.Value & 0x800) == 0)) &&
     (((pAVar2->super_AActor).BounceFlags.Value & 0x1000) == 0)) {
    bVar5 = (bool)((byte)((uint)player->cheats >> 0x1e) & 1);
  }
  player->onground = bVar5;
  if ((player->cmd).ucmd.sidemove != 0 || (player->cmd).ucmd.forwardmove != 0) {
    dVar9 = P_GetMoveFactor(&pAVar2->super_AActor,&friction);
    dVar8 = (double)(~-(ulong)(friction < 0.90625) & 0x3fa0000000000000 |
                    -(ulong)(friction < 0.90625) & (ulong)dVar9);
    if (((player->onground == false) && (((player->mo->super_AActor).flags.Value & 0x200) == 0)) &&
       ((player->mo->super_AActor).waterlevel == 0)) {
      dVar9 = dVar9 * level.aircontrol;
      dVar8 = dVar8 * level.aircontrol;
    }
    uVar14 = 0;
    local_38 = (double)(int)(player->cmd).ucmd.forwardmove;
    local_40 = (double)(int)(player->cmd).ucmd.sidemove;
    uVar13 = extraout_XMM0_Qb;
    APlayerPawn::TweakSpeeds(pAVar2,&local_38,&local_40);
    dVar10 = (player->mo->super_AActor).Speed * 0.00390625;
    dVar12 = local_38 * dVar10;
    dVar10 = dVar10 * local_40;
    dVar11 = dVar8;
    if ((player->morphTics == 0) || ((player->mo->PlayerFlags & 4) != 0)) {
      dVar1 = player->crouchfactor;
      if ((dVar1 != 1.0) || (NAN(dVar1))) {
        dVar12 = dVar12 * dVar1;
        dVar10 = dVar10 * dVar1;
        dVar11 = dVar8 * dVar1;
      }
    }
    dVar12 = dVar12 * dVar9;
    dVar10 = dVar10 * dVar9;
    uVar16 = 0;
    uVar15 = 0;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      local_48.Degrees = (pAVar2->super_AActor).Angles.Yaw.Degrees;
      P_Bob(player,&local_48,(double)(int)(player->cmd).ucmd.forwardmove * dVar11 * 0.00390625,true)
      ;
      local_50.Degrees = (pAVar2->super_AActor).Angles.Yaw.Degrees;
      P_ForwardThrust(player,&local_50,dVar12);
      dVar8 = dVar11;
    }
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      local_58.Degrees = (pAVar2->super_AActor).Angles.Yaw.Degrees + -90.0;
      P_Bob(player,&local_58,dVar11 * (double)(int)(player->cmd).ucmd.sidemove * 0.00390625,false);
      local_60.Degrees = (pAVar2->super_AActor).Angles.Yaw.Degrees;
      P_SideThrust(player,&local_60,dVar10);
    }
    if (debugfile != (FILE *)0x0) {
      uVar4 = 0x70;
      if (((uint)player->cheats >> 0xd & 1) == 0) {
        uVar4 = 0x20;
      }
      pAVar2 = player->mo;
      fprintf((FILE *)debugfile,"move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [",
              (pAVar2->super_AActor).__Pos.X,(pAVar2->super_AActor).__Pos.Y,
              (pAVar2->super_AActor).__Pos.Z,dVar12,SUB84(dVar10,0),SUB84(dVar9,0),friction,
              (long)&player[-0x916e].morphTics / 0x2a0 & 0xffffffff,uVar4,
              (ulong)(uint)(pAVar2->super_AActor).waterlevel,in_R9,dVar9,uVar13,dVar8,uVar14,dVar12,
              uVar15,dVar10,uVar16);
      ppmVar7 = &(player->mo->super_AActor).touching_sectorlist;
      while (pmVar3 = *ppmVar7, pmVar3 != (msecnode_t *)0x0) {
        fprintf((FILE *)debugfile,"%td ",((long)pmVar3->m_sector - (long)sectors) / 0x218);
        ppmVar7 = &pmVar3->m_tnext;
      }
      fwrite("]\n",2,1,(FILE *)debugfile);
    }
    uVar6 = player->cheats;
    if (((-(uint)(dVar10 == 0.0 && dVar12 == 0.0) | uVar6 >> 0xd) & 1) == 0) {
      APlayerPawn::PlayRunning(player->mo);
      uVar6 = player->cheats;
    }
    if ((char)uVar6 < '\0') {
      player->cheats = uVar6 & 0xffffff7f;
      (player->camera).field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)player->mo;
    }
  }
  return;
}

Assistant:

void P_MovePlayer (player_t *player)
{
	ticcmd_t *cmd = &player->cmd;
	APlayerPawn *mo = player->mo;

	// [RH] 180-degree turn overrides all other yaws
	if (player->turnticks)
	{
		player->turnticks--;
		mo->Angles.Yaw += (180. / TURN180_TICKS);
	}
	else
	{
		mo->Angles.Yaw += cmd->ucmd.yaw * (360./65536.);
	}

	player->onground = (mo->Z() <= mo->floorz) || (mo->flags2 & MF2_ONMOBJ) || (mo->BounceFlags & BOUNCE_MBF) || (player->cheats & CF_NOCLIP2);

	// killough 10/98:
	//
	// We must apply thrust to the player and bobbing separately, to avoid
	// anomalies. The thrust applied to bobbing is always the same strength on
	// ice, because the player still "works just as hard" to move, while the
	// thrust applied to the movement varies with 'movefactor'.

	if (cmd->ucmd.forwardmove | cmd->ucmd.sidemove)
	{
		double forwardmove, sidemove;
		double bobfactor;
		double friction, movefactor;
		double fm, sm;

		movefactor = P_GetMoveFactor (mo, &friction);
		bobfactor = friction < ORIG_FRICTION ? movefactor : ORIG_FRICTION_FACTOR;
		if (!player->onground && !(player->mo->flags & MF_NOGRAVITY) && !player->mo->waterlevel)
		{
			// [RH] allow very limited movement if not on ground.
			movefactor *= level.aircontrol;
			bobfactor*= level.aircontrol;
		}

		fm = cmd->ucmd.forwardmove;
		sm = cmd->ucmd.sidemove;
		mo->TweakSpeeds (fm, sm);
		fm *= player->mo->Speed / 256;
		sm *= player->mo->Speed / 256;

		// When crouching, speed and bobbing have to be reduced
		if (player->CanCrouch() && player->crouchfactor != 1)
		{
			fm *= player->crouchfactor;
			sm *= player->crouchfactor;
			bobfactor *= player->crouchfactor;
		}

		forwardmove = fm * movefactor * (35 / TICRATE);
		sidemove = sm * movefactor * (35 / TICRATE);

		if (forwardmove)
		{
			P_Bob(player, mo->Angles.Yaw, cmd->ucmd.forwardmove * bobfactor / 256., true);
			P_ForwardThrust(player, mo->Angles.Yaw, forwardmove);
		}
		if (sidemove)
		{
			P_Bob(player, mo->Angles.Yaw - 90, cmd->ucmd.sidemove * bobfactor / 256., false);
			P_SideThrust(player, mo->Angles.Yaw, sidemove);
		}

		if (debugfile)
		{
			fprintf (debugfile, "move player for pl %d%c: (%f,%f,%f) (%f,%f) %f %f w%d [", int(player-players),
				player->cheats&CF_PREDICTING?'p':' ',
				player->mo->X(), player->mo->Y(), player->mo->Z(),forwardmove, sidemove, movefactor, friction, player->mo->waterlevel);
			msecnode_t *n = player->mo->touching_sectorlist;
			while (n != NULL)
			{
				fprintf (debugfile, "%td ", n->m_sector-sectors);
				n = n->m_tnext;
			}
			fprintf (debugfile, "]\n");
		}

		if (!(player->cheats & CF_PREDICTING) && (forwardmove != 0 || sidemove != 0))
		{
			player->mo->PlayRunning ();
		}

		if (player->cheats & CF_REVERTPLEASE)
		{
			player->cheats &= ~CF_REVERTPLEASE;
			player->camera = player->mo;
		}
	}
}